

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

matches * atomreg_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *expr;
  match *res;
  int iVar1;
  matches *__ptr;
  
  if ((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_EXPR)) {
    expr = ctx->atoms[spos]->expr;
    __ptr = alwaysmatches(spos + 1);
    res = __ptr->m;
    iVar1 = matchreg(res,(reg *)v,expr,ctx);
    if (iVar1 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomreg_a APROTO {
	const struct reg *reg = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	struct matches *res = alwaysmatches(spos+1);
	if (matchreg(res->m, reg, e, ctx))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}